

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

bool TestEvaluation(ExpressionContext *ctx,VmModule *module,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  bool bVar1;
  undefined1 local_368 [8];
  InstructionVMEvalContext evalCtx;
  uint errorBufSize_local;
  char *errorBuf_local;
  uint resultBufSize_local;
  char *resultBuf_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  evalCtx.allocator._4_4_ = errorBufSize;
  InstructionVMEvalContext::InstructionVMEvalContext
            ((InstructionVMEvalContext *)local_368,ctx,ctx->allocator);
  evalCtx.errorBuf._0_4_ = evalCtx.allocator._4_4_;
  evalCtx.storageSet.allocator._0_1_ = 1;
  evalCtx.ctx = (ExpressionContext *)errorBuf;
  bVar1 = EvaluateToBuffer((InstructionVMEvalContext *)local_368,module,resultBuf,resultBufSize);
  InstructionVMEvalContext::~InstructionVMEvalContext((InstructionVMEvalContext *)local_368);
  return bVar1;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, VmModule *module, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	InstructionVMEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, module, resultBuf, resultBufSize);
}